

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_reboot(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  byte bVar4;
  AREA_DATA_conflict **ppAVar5;
  string area;
  char arg1 [4608];
  char send [4608];
  char *local_2478 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2458;
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar3 = one_argument(argument,local_2438);
  iVar2 = atoi(local_2438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2478,"",(allocator<char> *)&local_2458);
  ppAVar5 = &area_first;
  bVar4 = 0;
  while (ppAVar5 = &((AREA_DATA_conflict *)ppAVar5)->next->next,
        (AREA_DATA_conflict *)ppAVar5 != (AREA_DATA_conflict *)0x0) {
    if ((((AREA_DATA_conflict *)ppAVar5)->area_flags[0] & 0x18) != 0) {
      fmt::v9::sprintf<char[7],char*,char>
                (&local_2458,(v9 *)"%24s\n\r",(char (*) [7])&((AREA_DATA_conflict *)ppAVar5)->name,
                 (char **)CONCAT71(in_register_00000009,in_CL));
      std::__cxx11::string::append((string *)local_2478);
      std::__cxx11::string::~string((string *)&local_2458);
      bVar4 = 1;
    }
  }
  bVar1 = str_cmp(pcVar3,"now");
  if (bVar1) {
    bVar1 = str_cmp(local_2438,"now");
    if ((bVar1 & bVar4) == 1) {
      send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify \'now\' after your reboot command.\n\r"
                   ,ch);
      send_to_char(local_2478[0],ch);
      goto LAB_002ca8b8;
    }
  }
  if ((rebooting & iVar2 != -1) == 0) {
    if (rebooting != false || -1 < iVar2) {
      rebooting = true;
      if (iVar2 == -1) {
        sprintf(local_1238,"{R%s has cancelled the reboot.{x",ch->true_name);
        do_immecho(ch,local_1238);
        reboot_num = -1;
        rebooting = false;
      }
      else if (iVar2 == 0) {
        reboot_now(ch);
      }
      else {
        reboot_num = iVar2;
        start_reboot(ch);
      }
      goto LAB_002ca8b8;
    }
    pcVar3 = "There is no reboot in progress to cancel.\n\r";
  }
  else {
    pcVar3 = "Someone has already started a reboot.\n\r";
  }
  send_to_char(pcVar3,ch);
LAB_002ca8b8:
  std::__cxx11::string::~string((string *)local_2478);
  return;
}

Assistant:

void do_reboot(CHAR_DATA *ch, char *argument)
{
	int mins = 0;
	char send[MSL];
	char arg1[MSL];
	AREA_DATA *pArea = nullptr;
	bool found = false;

	argument = one_argument(argument, arg1);
	mins = atoi(arg1);

	std::string area = std::string("");
	for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
	{
		if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
		{
			found = true;
			area += fmt::sprintf("%24s\n\r", pArea->name);
		}
	}

	if ((str_cmp(argument, "now") && str_cmp(arg1, "now")) && found)
	{
		send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify 'now' after your reboot command.\n\r", ch);
		send_to_char(area.c_str(), ch);
		return;
	}

	if (rebooting && mins != -1)
	{
		send_to_char("Someone has already started a reboot.\n\r", ch);
		return;
	}

	if (!rebooting && mins < 0)
	{
		send_to_char("There is no reboot in progress to cancel.\n\r", ch);
		return;
	}

	rebooting = true;

	if (mins == 0)
	{
		reboot_now(ch);
	}
	else if (mins == -1)
	{
		sprintf(send, "{R%s has cancelled the reboot.{x", ch->true_name);
		do_immecho(ch, send);
		reboot_num = -1;
		rebooting = false;
	}
	else
	{
		reboot_num = mins;
		start_reboot(ch);
	}
}